

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# stb_vorbis.h
# Opt level: O0

void draw_line(float *output,int x0,int y0,int x1,int y1,int n)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  int iVar5;
  int in_ECX;
  int in_EDX;
  int in_ESI;
  long in_RDI;
  int in_R8D;
  int in_R9D;
  int sy;
  int err;
  int y;
  int x;
  int base;
  int ady;
  int adx;
  int dy;
  int local_3c;
  int local_38;
  int local_34;
  int local_30;
  int local_14;
  
  iVar2 = in_R8D - in_EDX;
  iVar3 = in_ECX - in_ESI;
  iVar4 = SDL_abs(iVar2);
  local_38 = 0;
  iVar5 = iVar2 / iVar3;
  if (iVar2 < 0) {
    local_3c = iVar5 + -1;
  }
  else {
    local_3c = iVar5 + 1;
  }
  iVar2 = SDL_abs(iVar5);
  local_14 = in_ECX;
  if (in_R9D < in_ECX) {
    local_14 = in_R9D;
  }
  if (in_ESI < local_14) {
    *(float *)(in_RDI + (long)in_ESI * 4) =
         inverse_db_table[in_EDX] * *(float *)(in_RDI + (long)in_ESI * 4);
    local_34 = in_EDX;
    for (local_30 = in_ESI + 1; local_30 < local_14; local_30 = local_30 + 1) {
      local_38 = (iVar4 - iVar2 * iVar3) + local_38;
      iVar1 = iVar5;
      if (iVar3 <= local_38) {
        local_38 = local_38 - iVar3;
        iVar1 = local_3c;
      }
      local_34 = iVar1 + local_34;
      *(float *)(in_RDI + (long)local_30 * 4) =
           inverse_db_table[local_34] * *(float *)(in_RDI + (long)local_30 * 4);
    }
  }
  return;
}

Assistant:

static __forceinline void draw_line(float *output, int x0, int y0, int x1, int y1, int n)
{
   int dy = y1 - y0;
   int adx = x1 - x0;
   int ady = abs(dy);
   int base;
   int x=x0,y=y0;
   int err = 0;
   int sy;

#ifdef STB_VORBIS_DIVIDE_TABLE
   if (adx < DIVTAB_DENOM && ady < DIVTAB_NUMER) {
      if (dy < 0) {
         base = -integer_divide_table[ady][adx];
         sy = base-1;
      } else {
         base =  integer_divide_table[ady][adx];
         sy = base+1;
      }
   } else {
      base = dy / adx;
      if (dy < 0)
         sy = base - 1;
      else
         sy = base+1;
   }
#else
   base = dy / adx;
   if (dy < 0)
      sy = base - 1;
   else
      sy = base+1;
#endif
   ady -= abs(base) * adx;
   if (x1 > n) x1 = n;
   if (x < x1) {
      LINE_OP(output[x], inverse_db_table[y]);
      for (++x; x < x1; ++x) {
         err += ady;
         if (err >= adx) {
            err -= adx;
            y += sy;
         } else
            y += base;
         LINE_OP(output[x], inverse_db_table[y]);
      }
   }
}